

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.cpp
# Opt level: O1

void __thiscall
pbrt::StatsAccumulator::ReportRareCheck
          (StatsAccumulator *this,char *condition,Float maxFrequency,int64_t numTrue,int64_t total)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Stats *pSVar2;
  undefined1 auVar3 [16];
  iterator iVar4;
  mapped_type *pmVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  allocator<char> local_79;
  key_type local_78;
  Float local_54;
  ulong local_50;
  undefined4 local_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  
  pSVar2 = this->stats;
  local_54 = maxFrequency;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,condition,(allocator<char> *)&local_44);
  local_50 = numTrue;
  iVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::StatsAccumulator::Stats::RareCheck>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::StatsAccumulator::Stats::RareCheck>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::StatsAccumulator::Stats::RareCheck>_>_>
          ::find(&(pSVar2->rareChecks)._M_t,&local_78);
  pSVar2 = this->stats;
  paVar1 = &local_78.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)iVar4._M_node == &(pSVar2->rareChecks)._M_t._M_impl.super__Rb_tree_header)
  {
    uStack_40 = 0;
    uStack_3c = 0;
    uStack_38 = 0;
    uStack_34 = 0;
    pSVar2 = this->stats;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,condition,&local_79);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::StatsAccumulator::Stats::RareCheck,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::StatsAccumulator::Stats::RareCheck>_>_>
             ::operator[](&pSVar2->rareChecks,&local_78);
    pmVar5->maxFrequency = local_54;
    *(undefined4 *)((long)&pmVar5->total + 4) = uStack_34;
    *(ulong *)&pmVar5->field_0x4 = CONCAT44(uStack_40,local_44);
    *(ulong *)((long)&pmVar5->numTrue + 4) = CONCAT44(uStack_38,uStack_3c);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar1) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
  }
  pSVar2 = this->stats;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,condition,(allocator<char> *)&local_44);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::StatsAccumulator::Stats::RareCheck,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::StatsAccumulator::Stats::RareCheck>_>_>
           ::operator[](&pSVar2->rareChecks,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  auVar6._8_8_ = 0;
  auVar6._0_8_ = total;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = local_50;
  auVar6 = vpunpcklqdq_avx(auVar7,auVar6);
  auVar3._0_8_ = pmVar5->numTrue;
  auVar3._8_8_ = pmVar5->total;
  auVar3 = vpaddq_avx(auVar6,auVar3);
  pmVar5->numTrue = auVar3._0_8_;
  pmVar5->total = auVar3._8_8_;
  return;
}

Assistant:

void StatsAccumulator::ReportRareCheck(const char *condition, Float maxFrequency,
                                       int64_t numTrue, int64_t total) {
    if (stats->rareChecks.find(condition) == stats->rareChecks.end())
        stats->rareChecks[condition] = Stats::RareCheck(maxFrequency);
    Stats::RareCheck &rc = stats->rareChecks[condition];
    rc.numTrue += numTrue;
    rc.total += total;
}